

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationOverWriteCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  int iVar2;
  int ndx;
  int iVar3;
  char *pcVar4;
  int local_284;
  int local_278;
  int local_274;
  string localID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream buf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  for (iVar3 = 0; iVar3 < *(int *)((long)this + 0x90); iVar3 = iVar3 + 1) {
    if (*(int *)((long)this + 0x78) == 1) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar1 = std::operator<<((ostream *)&buf,
                                 "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
        pcVar4 = "), 456);\n";
      }
      else {
        poVar1 = std::operator<<((ostream *)&buf,
                                 "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
        pcVar4 = "), ivec4(456, 0, 0, 0));\n";
      }
LAB_01288e4c:
      std::operator<<(poVar1,pcVar4);
    }
    else if (*(int *)((long)this + 0x78) == 0) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar1 = std::operator<<((ostream *)&buf,
                                 "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
        pcVar4 = ")], 456);\n";
      }
      else {
        poVar1 = std::operator<<((ostream *)&buf,
                                 "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
        pcVar4 = ")] = 456;\n";
      }
      goto LAB_01288e4c;
    }
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(&localID,this);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&localID);
  std::__cxx11::string::~string((string *)&localID);
  iVar3 = 4;
  local_284 = 0;
  while( true ) {
    iVar2 = iVar3 + -4;
    if (*(int *)((long)this + 0x90) <= iVar2) break;
    if (*(char *)((long)this + 0x7e) == '\x01') {
      local_274 = iVar3;
      de::toString<int>(&local_208,&local_274);
      std::operator+(&local_1e8,"(gl_LocalInvocationID.xy + uvec2(",&local_208);
      std::operator+(&local_248,&local_1e8,", ");
      local_278 = local_284;
      de::toString<int>(&local_228,&local_278);
      std::operator+(&local_1c8,&local_248,&local_228);
      std::operator+(&localID,&local_1c8,")) % gl_WorkGroupSize.xy");
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&localID,"gl_LocalInvocationID.xy",(allocator<char> *)&local_1c8);
    }
    if (*(int *)((long)this + 0x78) == 1) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\timageAtomicExchange(u_image, getCoord(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = "), groupNdx);\n";
      }
      else {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\timageStore(u_image, getCoord(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = "), ivec4(groupNdx, 0, 0, 0));\n";
      }
LAB_012890cd:
      std::operator<<(poVar1,pcVar4);
    }
    else if (*(int *)((long)this + 0x78) == 0) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tatomicExchange(sb_store.values[getIndex(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = ")], groupNdx);\n";
      }
      else {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tsb_store.values[getIndex(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = ")] = groupNdx;\n";
      }
      goto LAB_012890cd;
    }
    std::__cxx11::string::~string((string *)&localID);
    iVar3 = iVar3 + 1;
    local_284 = local_284 + 3;
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(&localID,this);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&localID);
  std::__cxx11::string::~string((string *)&localID);
  local_284 = 0;
  iVar3 = 1;
  do {
    iVar2 = iVar3 + -1;
    if (*(int *)((long)this + 0x90) <= iVar2) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      return __return_storage_ptr__;
    }
    if (*(char *)((long)this + 0x7e) == '\x01') {
      local_274 = iVar3;
      de::toString<int>(&local_208,&local_274);
      std::operator+(&local_1e8,"(gl_LocalInvocationID.xy + uvec2(",&local_208);
      std::operator+(&local_248,&local_1e8,", ");
      local_278 = local_284;
      de::toString<int>(&local_228,&local_278);
      std::operator+(&local_1c8,&local_248,&local_228);
      std::operator+(&localID,&local_1c8,")) % gl_WorkGroupSize.xy");
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&localID,"gl_LocalInvocationID.xy",(allocator<char> *)&local_1c8);
    }
    if (*(int *)((long)this + 0x78) == 1) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = "), 123) == groupNdx);\n";
      }
      else {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (imageLoad(u_image, getCoord(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = ")).x == groupNdx);\n";
      }
LAB_01289358:
      std::operator<<(poVar1,pcVar4);
    }
    else if (*(int *)((long)this + 0x78) == 0) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = ")], 123) == groupNdx);\n";
      }
      else {
        poVar1 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (sb_store.values[getIndex(");
        poVar1 = std::operator<<(poVar1,(string *)&localID);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        pcVar4 = ")] == groupNdx);\n";
      }
      goto LAB_01289358;
    }
    std::__cxx11::string::~string((string *)&localID);
    local_284 = local_284 + 2;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

std::string InvocationOverWriteCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], 456);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = 456;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), 456);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(456, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// write over

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// write another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+4) + ", " + de::toString(3*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(" << localID << ", " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(" << localID << ", " << ndx << "), ivec4(groupNdx, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// check another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 123) == groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 123) == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == groupNdx);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}